

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O2

void protozero::skip_varint(char **data,char *end)

{
  char *pcVar1;
  undefined8 *puVar2;
  long lVar3;
  pointer_____offset_0x10___ *ppuVar4;
  char *pcVar5;
  
  pcVar1 = *data;
  lVar3 = 0;
  pcVar5 = pcVar1;
  do {
    if (pcVar5 == end) {
      if ((long)end - (long)pcVar1 < 10) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = &PTR__exception_0019c7b8;
        ppuVar4 = &end_of_buffer_exception::typeinfo;
      }
      else {
LAB_001544d2:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = &PTR__exception_0019c790;
        ppuVar4 = &varint_too_long_exception::typeinfo;
      }
      __cxa_throw(puVar2,ppuVar4,std::exception::~exception);
    }
    if (-1 < *pcVar5) {
      if (-lVar3 < 10) {
        *data = pcVar1 + (1 - lVar3);
        return;
      }
      goto LAB_001544d2;
    }
    pcVar5 = pcVar5 + 1;
    lVar3 = lVar3 + -1;
  } while( true );
}

Assistant:

inline void skip_varint(const char** data, const char* end) {
    const auto* begin = reinterpret_cast<const int8_t*>(*data);
    const auto* iend = reinterpret_cast<const int8_t*>(end);
    const int8_t* p = begin;

    while (p != iend && *p < 0) {
        ++p;
    }

    if (p - begin >= max_varint_length) {
        throw varint_too_long_exception{};
    }

    if (p == iend) {
        throw end_of_buffer_exception{};
    }

    ++p;

    *data = reinterpret_cast<const char*>(p);
}